

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

void __thiscall cmCTestGIT::CommitParser::~CommitParser(CommitParser *this)

{
  CommitParser *this_local;
  
  ~CommitParser(this);
  operator_delete(this,0x198);
  return;
}

Assistant:

CommitParser(cmCTestGIT* git, const char* prefix)
    : DiffParser(git, prefix)
  {
    this->Separator = SectionSep[this->Section];
  }